

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void __thiscall
kj::UnixEventPort::SignalPromiseAdapter::~SignalPromiseAdapter(SignalPromiseAdapter *this)

{
  SignalPromiseAdapter *pSVar1;
  SignalPromiseAdapter **ppSVar2;
  
  ppSVar2 = this->prev;
  if (ppSVar2 != (SignalPromiseAdapter **)0x0) {
    pSVar1 = this->next;
    if (pSVar1 == (SignalPromiseAdapter *)0x0) {
      this->loop->signalTail = ppSVar2;
    }
    else {
      pSVar1->prev = ppSVar2;
      ppSVar2 = this->prev;
    }
    *ppSVar2 = pSVar1;
  }
  return;
}

Assistant:

~SignalPromiseAdapter() noexcept(false) {
    if (prev != nullptr) {
      if (next == nullptr) {
        loop.signalTail = prev;
      } else {
        next->prev = prev;
      }
      *prev = next;
    }
  }